

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigUtil.c
# Opt level: O0

void Aig_ManPrintVerbose(Aig_Man_t *p,int fHaig)

{
  int iVar1;
  Vec_Ptr_t *p_00;
  Aig_Obj_t *pObj_00;
  int local_2c;
  int i;
  Aig_Obj_t *pObj;
  Vec_Ptr_t *vNodes;
  int fHaig_local;
  Aig_Man_t *p_local;
  
  printf("PIs: ");
  for (local_2c = 0; iVar1 = Vec_PtrSize(p->vCis), local_2c < iVar1; local_2c = local_2c + 1) {
    Vec_PtrEntry(p->vCis,local_2c);
    printf(" %p");
  }
  printf("\n");
  p_00 = Aig_ManDfs(p,0);
  for (local_2c = 0; iVar1 = Vec_PtrSize(p_00), local_2c < iVar1; local_2c = local_2c + 1) {
    pObj_00 = (Aig_Obj_t *)Vec_PtrEntry(p_00,local_2c);
    Aig_ObjPrintVerbose(pObj_00,fHaig);
    printf("\n");
  }
  printf("\n");
  Vec_PtrFree(p_00);
  return;
}

Assistant:

void Aig_ManPrintVerbose( Aig_Man_t * p, int fHaig )
{
    Vec_Ptr_t * vNodes;
    Aig_Obj_t * pObj;
    int i;
    printf( "PIs: " );
    Aig_ManForEachCi( p, pObj, i )
        printf( " %p", pObj );
    printf( "\n" );
    vNodes = Aig_ManDfs( p, 0 );
    Vec_PtrForEachEntry( Aig_Obj_t *, vNodes, pObj, i )
        Aig_ObjPrintVerbose( pObj, fHaig ), printf( "\n" );
    printf( "\n" );
    Vec_PtrFree( vNodes );
}